

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vec_t vVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  ostream *poVar8;
  HgtFilesGrid *this;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  char *pcVar9;
  undefined8 *puVar10;
  FILE *__s;
  void *__ptr;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tgts;
  long lVar12;
  int iSquare;
  undefined4 uVar13;
  uint uVar14;
  int jSquare;
  int j;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar16;
  double dVar17;
  initializer_list<float> __l;
  int quadSize;
  int zoom;
  float bottomrightlat;
  float bottomrightlon;
  float topleftlat;
  float topleftlon;
  string inputdir;
  string outputdir;
  vector<float,_std::allocator<float>_> bottomrightlonlat;
  group cli;
  vec3_t line [2];
  string zoomDir;
  string fileName;
  vec3_t tr [3];
  char ccn [10];
  undefined1 local_1d0c [7];
  bool local_1d05;
  uint local_1d04;
  uint local_1d00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1cfc;
  undefined1 local_1cec [12];
  ulong uStack_1ce0;
  int local_1ccc;
  uint local_1cc8;
  float local_1cc4;
  float local_1cc0;
  float local_1cbc;
  float local_1cb8;
  undefined1 local_1cb4 [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ca8;
  HgtFilesGrid *local_1c98;
  int local_1c90;
  int local_1c8c;
  int local_1c88;
  uint local_1c84;
  uint local_1c80;
  undefined4 local_1c7c;
  double local_1c78;
  undefined8 uStack_1c70;
  double local_1c68;
  undefined8 uStack_1c60;
  undefined1 local_1c58 [16];
  ulong local_1c48;
  ulong local_1c40;
  double local_1c38;
  doc_string local_1c30;
  doc_string local_1c10;
  long *local_1bf0 [2];
  long local_1be0 [2];
  long *local_1bd0 [2];
  long local_1bc0 [2];
  long *local_1bb0 [2];
  long local_1ba0 [2];
  long *local_1b90 [2];
  long local_1b80 [2];
  long *local_1b70 [2];
  long local_1b60 [2];
  long *local_1b50 [2];
  long local_1b40 [2];
  long *local_1b30 [2];
  long local_1b20 [2];
  long *local_1b10 [2];
  long local_1b00 [2];
  long *local_1af0 [2];
  long local_1ae0 [2];
  ulong local_1ad0;
  ulong local_1ac8;
  double local_1ac0;
  double local_1ab8;
  vec_t local_1ab0;
  double local_1aa8;
  double local_1aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a78;
  long *local_1a58 [2];
  long local_1a48 [2];
  long *local_1a38 [2];
  long local_1a28 [2];
  long *local_1a18 [2];
  long local_1a08 [2];
  long *local_19f8 [2];
  long local_19e8 [2];
  long *local_19d8 [2];
  long local_19c8 [2];
  vector<float,_std::allocator<float>_> local_19b8;
  doc_string local_19a0;
  group local_1980;
  group local_1938;
  group local_18f0;
  group local_18a8;
  group local_1860;
  group local_1818;
  group local_17d0;
  group local_1788;
  group local_1740;
  group local_16f8;
  group local_16b0;
  group local_1668;
  group local_1620;
  undefined1 local_15d8 [8];
  const_iterator local_15d0;
  undefined1 local_15c8 [16];
  _Alloc_hider local_15b8;
  pointer local_15b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15a8 [13];
  parameter local_14d8;
  parameter local_13d8;
  undefined1 local_12d8 [40];
  pointer local_12b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12a8;
  _Alloc_hider local_1298;
  parameter local_1030;
  parameter local_f30;
  parameter local_e30;
  parameter local_d30;
  parameter local_c30;
  parameter local_b30;
  parameter local_a30;
  parameter local_930;
  parameter local_830;
  parameter local_730;
  parameter local_630;
  parameter local_530;
  parameter local_430;
  parameter local_330;
  parameter local_230;
  parameter local_130;
  ulong uVar15;
  
  local_1c10._M_dataplus._M_p = (pointer)&local_1c10.field_2;
  local_1c10._M_string_length = 0;
  local_1c10.field_2._M_local_buf[0] = '\0';
  local_1c30._M_dataplus._M_p = (pointer)&local_1c30.field_2;
  local_1c30._M_string_length = 0;
  local_1c30.field_2._M_local_buf[0] = '\0';
  local_1cec._0_4_ = 0xb;
  local_1d0c._0_4_ = 0x21;
  local_1cb8 = -180.0;
  local_1cbc = 85.0;
  local_1cc0 = 180.0;
  local_1cc4 = 0.0;
  local_12d8._0_8_ = (pointer)0x43340000;
  tgts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15d8;
  __l._M_len = 2;
  __l._M_array = (iterator)local_12d8;
  std::vector<float,_std::allocator<float>_>::vector(&local_19b8,__l,(allocator_type *)tgts);
  clipp::required<char_const(&)[3],char_const(&)[12]>
            ((parameter *)local_12d8,(clipp *)"-o",(char (*) [3])"--outputdir",(char (*) [12])tgts);
  local_1af0[0] = local_1ae0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1af0,"output directory root","");
  std::__cxx11::string::operator=((string *)local_12d8,(string *)local_1af0);
  clipp::parameter::parameter(&local_130,(parameter *)local_12d8);
  local_1b10[0] = local_1b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b10,"outputdir","");
  clipp::value<std::__cxx11::string&>(&local_230,(clipp *)local_1b10,&local_1c10,tgts);
  clipp::operator&(&local_1740,&local_130,&local_230);
  clipp::required<char_const(&)[3],char_const(&)[11]>
            ((parameter *)local_15d8,(clipp *)"-i",(char (*) [3])"--inputdir",(char (*) [11])tgts);
  local_1b30[0] = local_1b20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b30,
             "input directory containing hgt files from \t\t\thttp://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm"
             ,"");
  std::__cxx11::string::operator=((string *)local_15d8,(string *)local_1b30);
  clipp::parameter::parameter(&local_330,(parameter *)local_15d8);
  local_1b50[0] = local_1b40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b50,"inputdir","");
  clipp::value<std::__cxx11::string&>(&local_430,(clipp *)local_1b50,&local_1c30,tgts);
  clipp::operator&(&local_1788,&local_330,&local_430);
  clipp::operator_(&local_16f8,&local_1740,&local_1788);
  clipp::option<char_const(&)[3],char_const(&)[12]>
            (&local_14d8,(clipp *)"-z",(char (*) [3])"--zoomlevel",(char (*) [12])tgts);
  local_1b70[0] = local_1b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b70,"target zoom level","");
  std::__cxx11::string::operator=((string *)&local_14d8,(string *)local_1b70);
  clipp::parameter::parameter(&local_530,&local_14d8);
  local_1b90[0] = local_1b80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b90,"zoom","");
  clipp::value<int&>(&local_630,(clipp *)local_1b90,(doc_string *)local_1cec,(int *)tgts);
  clipp::operator&(&local_17d0,&local_530,&local_630);
  clipp::operator_(&local_16b0,&local_16f8,&local_17d0);
  clipp::option<char_const(&)[3],char_const(&)[8]>
            (&local_13d8,(clipp *)"-s",(char (*) [3])"--start",(char (*) [8])tgts);
  local_1bb0[0] = local_1ba0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1bb0,"Start lon lat coordonates","");
  std::__cxx11::string::operator=((string *)&local_13d8,(string *)local_1bb0);
  clipp::parameter::parameter(&local_730,&local_13d8);
  local_1bd0[0] = local_1bc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bd0,"lon","");
  clipp::value<float&>(&local_830,(clipp *)local_1bd0,(doc_string *)&local_1cb8,(float *)tgts);
  clipp::operator&(&local_1860,&local_730,&local_830);
  local_1bf0[0] = local_1be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bf0,"lat","");
  clipp::value<float&>(&local_930,(clipp *)local_1bf0,(doc_string *)&local_1cbc,(float *)tgts);
  clipp::operator&(&local_1818,&local_1860,&local_930);
  clipp::operator_(&local_1668,&local_16b0,&local_1818);
  clipp::option<char_const(&)[3],char_const(&)[6]>
            (&local_1030,(clipp *)"-e",(char (*) [3])"--end",(char (*) [6])tgts);
  local_19d8[0] = local_19c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19d8,"End lon lat coordonates","")
  ;
  std::__cxx11::string::operator=((string *)&local_1030,(string *)local_19d8);
  clipp::parameter::parameter(&local_a30,&local_1030);
  local_19f8[0] = local_19e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19f8,"lon","");
  clipp::value<float&>(&local_b30,(clipp *)local_19f8,(doc_string *)&local_1cc0,(float *)tgts);
  clipp::operator&(&local_18f0,&local_a30,&local_b30);
  local_1a18[0] = local_1a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a18,"lat","");
  clipp::value<float&>(&local_c30,(clipp *)local_1a18,(doc_string *)&local_1cc4,(float *)tgts);
  clipp::operator&(&local_18a8,&local_18f0,&local_c30);
  clipp::operator_(&local_1620,&local_1668,&local_18a8);
  clipp::option<char_const(&)[3],char_const(&)[11]>
            (&local_e30,(clipp *)"-x",(char (*) [3])"--quadsize",(char (*) [11])tgts);
  local_1cec._4_4_ = argc;
  local_1a38[0] = local_1a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a38,"Quadsize resolution default 33","");
  local_1cfc._4_8_ = argv;
  std::__cxx11::string::operator=((string *)&local_e30,(string *)local_1a38);
  clipp::parameter::parameter(&local_d30,&local_e30);
  local_1a58[0] = local_1a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a58,"size","");
  clipp::value<int&>(&local_f30,(clipp *)local_1a58,(doc_string *)local_1d0c,(int *)tgts);
  clipp::operator&(&local_1938,&local_d30,&local_f30);
  clipp::operator_(&local_1980,&local_1620,&local_1938);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1938.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1938.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1938.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1938.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_f30);
  if (local_1a58[0] != local_1a48) {
    operator_delete(local_1a58[0],local_1a48[0] + 1);
  }
  clipp::parameter::~parameter(&local_d30);
  if (local_1a38[0] != local_1a28) {
    operator_delete(local_1a38[0],local_1a28[0] + 1);
  }
  clipp::parameter::~parameter(&local_e30);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1620.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1620.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1620.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1620.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1620.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_18a8.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a8.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_18a8.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_18a8.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_18a8.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_c30);
  if (local_1a18[0] != local_1a08) {
    operator_delete(local_1a18[0],local_1a08[0] + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_18f0.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_18f0.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_18f0.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_18f0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_b30);
  if (local_19f8[0] != local_19e8) {
    operator_delete(local_19f8[0],local_19e8[0] + 1);
  }
  clipp::parameter::~parameter(&local_a30);
  if (local_19d8[0] != local_19c8) {
    operator_delete(local_19d8[0],local_19c8[0] + 1);
  }
  clipp::parameter::~parameter(&local_1030);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1668.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1668.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1668.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1668.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1668.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1818.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1818.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1818.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1818.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1818.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_930);
  if (local_1bf0[0] != local_1be0) {
    operator_delete(local_1bf0[0],local_1be0[0] + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1860.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1860.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1860.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1860.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1860.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_830);
  if (local_1bd0[0] != local_1bc0) {
    operator_delete(local_1bd0[0],local_1bc0[0] + 1);
  }
  clipp::parameter::~parameter(&local_730);
  if (local_1bb0[0] != local_1ba0) {
    operator_delete(local_1bb0[0],local_1ba0[0] + 1);
  }
  clipp::parameter::~parameter(&local_13d8);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_16b0.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_16b0.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_16b0.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_16b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_17d0.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_17d0.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_17d0.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_17d0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_630);
  if (local_1b90[0] != local_1b80) {
    operator_delete(local_1b90[0],local_1b80[0] + 1);
  }
  clipp::parameter::~parameter(&local_530);
  if (local_1b70[0] != local_1b60) {
    operator_delete(local_1b70[0],local_1b60[0] + 1);
  }
  clipp::parameter::~parameter(&local_14d8);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_16f8.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_16f8.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_16f8.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_16f8.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1788.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1788.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1788.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1788.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1788.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_430);
  if (local_1b50[0] != local_1b40) {
    operator_delete(local_1b50[0],local_1b40[0] + 1);
  }
  clipp::parameter::~parameter(&local_330);
  if (local_1b30[0] != local_1b20) {
    operator_delete(local_1b30[0],local_1b20[0] + 1);
  }
  clipp::parameter::~parameter((parameter *)local_15d8);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1740.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1740.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1740.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1740.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1740.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  clipp::parameter::~parameter(&local_230);
  if (local_1b10[0] != local_1b00) {
    operator_delete(local_1b10[0],local_1b00[0] + 1);
  }
  clipp::parameter::~parameter(&local_130);
  if (local_1af0[0] != local_1ae0) {
    operator_delete(local_1af0[0],local_1ae0[0] + 1);
  }
  clipp::parameter::~parameter((parameter *)local_12d8);
  uVar3 = local_1cfc._4_8_;
  clipp::parse((parsing_result *)local_12d8,local_1cec._4_4_,(char **)local_1cfc._4_8_,&local_1980,1
              );
  bVar4 = clipp::parsing_result::any_error((parsing_result *)local_12d8);
  if ((void *)local_12d8._24_8_ != (void *)0x0) {
    operator_delete((void *)local_12d8._24_8_,(long)local_12b0 - local_12d8._24_8_);
  }
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
            ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
             local_12d8);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19a0,*(char **)uVar3,(allocator<char> *)&local_14d8);
    memset((doc_formatting *)local_12d8,0,0x2a8);
    clipp::doc_formatting::doc_formatting((doc_formatting *)local_12d8);
    clipp::make_man_page
              ((man_page *)local_15d8,&local_1980,&local_19a0,(doc_formatting *)local_12d8);
    local_1a78._M_dataplus._M_p = (pointer)&local_1a78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a78,"DESCRIPTION","");
    local_1a98._M_dataplus._M_p = (pointer)&local_1a98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a98,
               "    This tools generates ddm file for openglobus.org \n    It needs data from  \n    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n    it is based on the fallowing project: \n    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
               ,"");
    std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
    _M_emplace_aux<std::__cxx11::string,std::__cxx11::string>
              ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
               &local_15d0,local_15d0,&local_1a78,&local_1a98);
    clipp::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (man_page *)local_15d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a98._M_dataplus._M_p != &local_1a98.field_2) {
      operator_delete(local_1a98._M_dataplus._M_p,local_1a98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a78._M_dataplus._M_p != &local_1a78.field_2) {
      operator_delete(local_1a78._M_dataplus._M_p,local_1a78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8._M_p != local_15a8) {
      operator_delete(local_15b8._M_p,(ulong)(local_15a8[0]._M_allocated_capacity + 1));
    }
    std::vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>::~vector
              ((vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_> *)
               &local_15d0);
    clipp::doc_formatting::~doc_formatting((doc_formatting *)local_12d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_19a0._M_dataplus._M_p != &local_19a0.field_2) {
      operator_delete(local_19a0._M_dataplus._M_p,local_19a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"zoom: ",6);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1cec._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"topleftlonlat: ",0xf);
    poVar8 = std::ostream::_M_insert<double>((double)local_1cb8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
    poVar8 = std::ostream::_M_insert<double>((double)local_1cbc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"bottomrightlonlat: ",0x13);
    poVar8 = std::ostream::_M_insert<double>((double)local_1cc0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
    poVar8 = std::ostream::_M_insert<double>((double)local_1cc4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quadsize: ",10);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1d0c._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    local_1c68 = (double)local_1cb8;
    uStack_1c60 = 0;
    local_1c78 = (double)local_1cc0;
    uStack_1c70 = 0;
    dVar16 = tan((((double)local_1cbc + 90.0) * 3.141592653589793) / 360.0);
    dVar16 = log(dVar16);
    unique0x10000b06 = extraout_XMM0_Dc;
    local_1cec._4_8_ = dVar16;
    unique0x10000b0a = extraout_XMM0_Dd;
    dVar16 = tan((((double)local_1cc4 + 90.0) * 3.141592653589793) / 360.0);
    dVar16 = log(dVar16);
    local_1c58._8_4_ = extraout_XMM0_Dc_00;
    local_1c58._0_8_ = dVar16;
    local_1c58._12_4_ = extraout_XMM0_Dd_00;
    local_1cfc._4_8_ = ldexp(1.0,local_1cec._0_4_);
    uVar13 = local_1d0c._0_4_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"qm_start_in_grid: ",0x12);
    uVar14 = (uint)(double)local_1cfc._4_8_;
    uVar15 = (ulong)uVar14;
    dVar17 = (double)local_1cec._4_8_ / 3.141592653589793;
    local_1ac0 = 40075016.68 / (double)(int)((uVar13 + -1) * uVar14);
    dVar16 = (double)(uVar13 + -1) * local_1ac0;
    local_1cec._4_8_ = dVar16;
    local_1c8c = (int)((20037508.34 - (double)(int)(dVar17 * 20037508.34)) / dVar16);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<->",3);
    local_1c90 = (int)((20037508.34 -
                       (double)(int)(((double)local_1c58._0_8_ / 3.141592653589793) * 20037508.34))
                      / (double)local_1cec._4_8_);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"qn_start_in_grid: ",0x12);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (int)(((double)(int)((local_1c68 * 20037508.34) / 180.0) + -20037508.34) /
                             (double)local_1cec._4_8_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<->",3);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(int)(((double)(int)((local_1c78 * 20037508.34) / 180.0) +
                                     -20037508.34) / (double)local_1cec._4_8_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    this = (HgtFilesGrid *)operator_new(0x17edc8);
    HgtFilesGrid::HgtFilesGrid(this);
    HgtFilesGrid::Init(this,4,local_1c30._M_dataplus._M_p);
    local_1c88 = local_1d0c._0_4_;
    local_1c48 = (ulong)(uint)(local_1d0c._0_4_ * local_1d0c._0_4_);
    local_1cb4._4_8_ = operator_new__(local_1c48 * 8);
    vecSet((vec_t *)local_15d8,0.0,1000000.0,0.0);
    vecSet((vec_t *)(local_15c8 + 8),0.0,-1000000.0,0.0);
    local_1d0c[6] = 0 < (int)uVar14;
    if ((int)uVar14 < 1) {
      local_1ccc = 0;
    }
    else {
      local_1c84 = uVar14 - 1;
      local_1ac8 = local_1c48 * 4;
      local_1ad0 = 1;
      if (1 < (uint)local_1c48) {
        local_1ad0 = local_1c48 & 0xffffffff;
      }
      local_1ccc = 0;
      uVar13 = 0;
      local_1c98 = this;
      local_1c40 = uVar15;
      do {
        if ((local_1c8c <= (int)uVar13) && ((int)uVar13 <= local_1c90)) {
          local_1cfc._M_allocated_capacity._0_4_ = uVar13;
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar15);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          local_1d04 = 0;
          local_1d05 = true;
          uVar13 = local_1cfc._M_allocated_capacity._0_4_;
          do {
            if ((int)local_1d0c._0_4_ < 1) {
              bVar4 = true;
            }
            else {
              local_1d00 = 0;
              local_1cc8 = (uint)CONCAT71((int7)((ulong)poVar8 >> 8),1);
              do {
                if (0 < (int)local_1d0c._0_4_) {
                  local_1c80 = local_1d00 | local_1d04;
                  lVar12 = 0;
                  do {
                    uVar14 = (uint)lVar12;
                    local_1cec._4_8_ =
                         (double)(int)(local_1d04 * (local_1d0c._0_4_ + -1) + uVar14) * local_1ac0 +
                         -20037508.34;
                    dVar16 = exp(((20037508.34 -
                                  (double)(int)((local_1d0c._0_4_ + -1) *
                                                local_1cfc._M_allocated_capacity._0_4_ + local_1d00)
                                  * local_1ac0) / 20037508.34) * 3.141592653589793);
                    dVar16 = atan(dVar16);
                    local_1cfc._4_8_ = (dVar16 + dVar16 + -1.5707963267948966) * 57.29577951308232;
                    local_1cec._4_8_ = ((double)local_1cec._4_8_ * 180.0) / 20037508.34;
                    local_1c58._0_8_ = lVar12;
                    if ((local_1c80 == 0 && uVar14 == 0) ||
                       ((local_1d04 == local_1c84 &&
                        (local_1d0c._0_4_ - 1 == uVar14 && local_1d00 == local_1d0c._0_4_ - 1)))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"    lon: ",9);
                      poVar8 = std::ostream::_M_insert<double>((double)local_1cec._4_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," lat: ",6);
                      poVar8 = std::ostream::_M_insert<double>((double)local_1cfc._4_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    }
                    dVar16 = ceil(90.0 - (double)local_1cfc._4_8_);
                    iSquare = (int)dVar16;
                    dVar16 = floor((double)local_1cec._4_8_ + 180.0);
                    jSquare = (int)dVar16;
                    local_1c78 = floor((double)local_1cfc._4_8_);
                    local_1c78 = (double)local_1cfc._4_8_ - local_1c78;
                    local_1c68 = floor((double)local_1cec._4_8_);
                    local_1c68 = (double)local_1cec._4_8_ - local_1c68;
                    dVar16 = floor(local_1c78 / 0.0008333333333333334);
                    iVar7 = (int)dVar16;
                    dVar16 = floor(local_1c68 / 0.0008333333333333334);
                    j = (int)dVar16;
                    sVar5 = HgtFilesGrid::GetHeight(this,iSquare,jSquare,0x4af - iVar7,j);
                    local_1c68 = (double)CONCAT44(local_1c68._4_4_,(int)CONCAT62(extraout_var,sVar5)
                                                 );
                    local_1cb4._0_4_ = j + 1;
                    sVar5 = HgtFilesGrid::GetHeight
                                      (this,iSquare,jSquare,0x4af - iVar7,local_1cb4._0_4_);
                    local_1c7c = (undefined4)CONCAT62(extraout_var_00,sVar5);
                    sVar5 = HgtFilesGrid::GetHeight(this,iSquare,jSquare,0x4b0 - iVar7,j);
                    local_1c78 = (double)CONCAT62(local_1c78._2_6_,sVar5);
                    local_1c38 = (double)(int)local_1c68._0_2_;
                    local_1aa0 = (double)(0x5a - iSquare);
                    local_1ca8._8_8_ = (undefined8)(jSquare + -0xb4);
                    local_1aa8 = (double)j * 0.0008333333333333334 + (double)local_1ca8._8_8_;
                    local_1ca8._M_allocated_capacity =
                         (size_type)((double)(iVar7 + 1) * 0.0008333333333333334 + local_1aa0);
                    vecSet((vec_t *)local_12d8,local_1aa8,local_1c38,
                           (vec_t)local_1ca8._M_allocated_capacity);
                    sVar5 = (short)local_1c7c;
                    local_1ab0 = local_1c38;
                    if (j < 0x4b0) {
                      local_1ab0 = (double)(int)sVar5;
                    }
                    local_1ca8._8_8_ =
                         (size_type)
                         ((double)(int)local_1cb4._0_4_ * 0.0008333333333333334 + local_1ca8._8_8_);
                    vecSet((vec_t *)&local_12a8._M_allocated_capacity,(vec_t)local_1ca8._8_8_,
                           local_1ab0,(vec_t)local_1ca8._M_allocated_capacity);
                    local_1ab8 = (double)(int)local_1c78._0_2_;
                    dVar16 = local_1ab8;
                    if (iVar7 < 0) {
                      dVar16 = local_1c38;
                    }
                    local_1ca8._M_allocated_capacity =
                         (size_type)((double)iVar7 * 0.0008333333333333334 + local_1aa0);
                    vecSet((vec_t *)(local_12d8 + 0x18),local_1aa8,dVar16,
                           (vec_t)local_1ca8._M_allocated_capacity);
                    local_15c8._8_8_ = local_1cec._4_8_;
                    local_15d8 = (undefined1  [8])local_1cec._4_8_;
                    local_15b0 = (pointer)local_1cfc._4_8_;
                    local_15c8._0_8_ = local_1cfc._4_8_;
                    dVar16 = (double)local_1cec._4_8_ - (double)local_12a8._M_allocated_capacity;
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = uStack_1ce0;
                    stack0xffffffffffffe318 = auVar2 << 0x40;
                    if (((double)local_12b0 - (double)local_1298._M_p) * dVar16 -
                        ((double)local_12d8._24_8_ - (double)local_12a8._M_allocated_capacity) *
                        ((double)local_1cfc._4_8_ - (double)local_1298._M_p) < 0.0) {
                      sVar6 = HgtFilesGrid::GetHeight
                                        (local_1c98,iSquare,jSquare,0x4b0 - iVar7,local_1cb4._0_4_);
                      local_1cec._4_8_ = (double)(int)sVar6;
                      dVar16 = (double)(int)sVar6;
                      if (0x4af < j) {
                        dVar16 = local_1ab8;
                      }
                      if (iVar7 < 0) {
                        dVar16 = local_1ab0;
                      }
                      vecSet((vec_t *)local_12d8,(vec_t)local_1ca8._8_8_,dVar16,
                             (vec_t)local_1ca8._M_allocated_capacity);
                    }
                    lVar12 = (long)(int)local_1d00;
                    *(undefined8 *)
                     (local_1cb4._4_8_ + ((int)local_1d0c._0_4_ * lVar12 + local_1c58._0_8_) * 8) =
                         0;
                    if ((sVar5 == 0 && SUB82(local_1c68,0) == 0) && local_1c78._0_2_ == 0) {
                      if (((double)local_1cec._4_8_ != 0.0) || (NAN((double)local_1cec._4_8_)))
                      goto LAB_00104fe0;
                    }
                    else {
LAB_00104fe0:
                      vVar1 = LineIntersectPlane((vec3_t *)local_12d8,(vec3_t *)local_15d8);
                      *(vec_t *)(local_1cb4._4_8_ +
                                (lVar12 * (int)local_1d0c._0_4_ + local_1c58._0_8_) * 8) = vVar1;
                      local_1cc8 = local_1cc8 & 0xff;
                      if (0.0 < vVar1) {
                        local_1cc8 = 0;
                      }
                    }
                    lVar12 = local_1c58._0_8_ + 1;
                    uVar15 = local_1c40;
                    this = local_1c98;
                  } while ((int)lVar12 < (int)local_1d0c._0_4_);
                }
                uVar3 = local_1cb4._4_8_;
                local_1d00 = local_1d00 + 1;
              } while ((int)local_1d00 < (int)local_1d0c._0_4_);
              bVar4 = true;
              uVar13 = local_1cfc._M_allocated_capacity._0_4_;
              if ((local_1cc8 & 1) == 0) {
                local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p =
                     (pointer)&local_14d8.super_token<clipp::parameter>.doc_.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_14d8,local_1c10._M_dataplus._M_p,
                           local_1c10._M_dataplus._M_p + local_1c10._M_string_length);
                sprintf((char *)&local_1030,"%d",(ulong)(uint)local_1cec._0_4_);
                std::__cxx11::string::append((char *)&local_14d8);
                mkdir(local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,0x1c0);
                sprintf((char *)&local_1030,"%d",(ulong)(uint)local_1cfc._M_allocated_capacity._0_4_
                       );
                pcVar9 = (char *)std::__cxx11::string::append((char *)&local_14d8);
                puVar10 = (undefined8 *)std::__cxx11::string::append(pcVar9);
                mkdir((char *)*puVar10,0x1c0);
                local_13d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p =
                     (pointer)&local_13d8.super_token<clipp::parameter>.doc_.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_13d8,
                           local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,
                           local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p +
                           local_14d8.super_token<clipp::parameter>.doc_._M_string_length);
                std::__cxx11::string::append((char *)&local_13d8);
                sprintf((char *)&local_1030,"%d",(ulong)local_1d04);
                pcVar9 = (char *)std::__cxx11::string::append((char *)&local_13d8);
                std::__cxx11::string::append(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"droping: ",9);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    local_13d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,
                                    local_13d8.super_token<clipp::parameter>.doc_._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                __s = fopen(local_13d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,"wb");
                bVar4 = __s != (FILE *)0x0;
                if (__s == (FILE *)0x0) {
                  local_1ccc = 1;
                }
                else {
                  __ptr = operator_new__(local_1ac8);
                  if (local_1c88 != 0) {
                    uVar11 = 0;
                    do {
                      *(float *)((long)__ptr + uVar11 * 4) = (float)*(double *)(uVar3 + uVar11 * 8);
                      uVar11 = uVar11 + 1;
                    } while (local_1ad0 != uVar11);
                  }
                  fwrite(__ptr,4,local_1c48,__s);
                  operator_delete__(__ptr);
                  fclose(__s);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_13d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p !=
                    &local_13d8.super_token<clipp::parameter>.doc_.field_2) {
                  operator_delete(local_13d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,
                                  local_13d8.super_token<clipp::parameter>.doc_.field_2.
                                  _M_allocated_capacity + 1);
                }
                uVar13 = local_1cfc._M_allocated_capacity._0_4_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p !=
                    &local_14d8.super_token<clipp::parameter>.doc_.field_2) {
                  operator_delete(local_14d8.super_token<clipp::parameter>.doc_._M_dataplus._M_p,
                                  local_14d8.super_token<clipp::parameter>.doc_.field_2.
                                  _M_allocated_capacity + 1);
                  uVar13 = local_1cfc._M_allocated_capacity._0_4_;
                }
              }
            }
            if (!bVar4) break;
            local_1d04 = local_1d04 + 1;
            poVar8 = (ostream *)(ulong)local_1d04;
            local_1d05 = (int)local_1d04 < (int)(uint)uVar15;
          } while (local_1d04 != (uint)uVar15);
          if ((local_1d05 & 1U) != 0) break;
        }
        uVar13 = uVar13 + 1;
        local_1d0c[6] = (int)uVar13 < (int)(uint)uVar15;
      } while (uVar13 != (uint)uVar15);
    }
    iVar7 = local_1ccc;
    if ((local_1d0c[6] & 1) != 0) goto LAB_00105320;
    operator_delete__((void *)local_1cb4._4_8_);
  }
  iVar7 = 0;
LAB_00105320:
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_1980.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1980.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_1980.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_1980.super_token<clipp::group>.doc_._M_dataplus._M_p,
                    local_1980.super_token<clipp::group>.doc_.field_2._M_allocated_capacity + 1);
  }
  if (local_19b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_19b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_19b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_19b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c30._M_dataplus._M_p != &local_1c30.field_2) {
    operator_delete(local_1c30._M_dataplus._M_p,
                    CONCAT71(local_1c30.field_2._M_allocated_capacity._1_7_,
                             local_1c30.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c10._M_dataplus._M_p != &local_1c10.field_2) {
    operator_delete(local_1c10._M_dataplus._M_p,
                    CONCAT71(local_1c10.field_2._M_allocated_capacity._1_7_,
                             local_1c10.field_2._M_local_buf[0]) + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]){
	std::string outputdir;
	std::string inputdir;
	int zoom = 11;
	int quadSize = 33;
	float topleftlon = -180;
	float topleftlat = 85;
	float bottomrightlon = 180;
	float bottomrightlat = 0;
	std::vector<float> bottomrightlonlat{180, 0};
	vec_t incLat_merc, incLon_merc;

	auto cli = (
		required("-o", "--outputdir").doc("output directory root") \
		& value("outputdir", outputdir),
		required("-i", "--inputdir").doc("input directory containing hgt files from \
			http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm") \
		& value("inputdir", inputdir),
		option("-z", "--zoomlevel").doc("target zoom level") \
		& value("zoom", zoom),
		option("-s", "--start").doc("Start lon lat coordonates") \
		& value("lon", topleftlon) & value("lat", topleftlat),
		option("-e", "--end").doc("End lon lat coordonates") \
		& value("lon", bottomrightlon) & value("lat", bottomrightlat),
		option("-x", "--quadsize").doc("Quadsize resolution default 33") \
		& value("size", quadSize)
		);

	if (!parse(argc, argv, cli)) {
		std::cout << make_man_page(cli, argv[0])\
			.prepend_section("DESCRIPTION", 
                "    This tools generates ddm file for openglobus.org \n"
				"    It needs data from  \n"
				"    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n"
				"    it is based on the fallowing project: \n"
				"    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
			    "");
		return 0;
	}

	std::cout << "zoom: " << zoom << "\n";
	std::cout << "topleftlonlat: " << topleftlon << "|" << topleftlat << "\n";
	std::cout << "bottomrightlonlat: " << bottomrightlon << "|" << bottomrightlat << "\n";
	std::cout << "quadsize: " << quadSize << "\n";

	int qn_start = Lon2Merc(topleftlon);
	int qn_end = Lon2Merc(bottomrightlon);
	int qm_start = Lat2Merc(topleftlat);
	int qm_end = Lat2Merc(bottomrightlat);

	int quadsCount = pow(2, zoom); //(dstFieldSize - 1) / 32;
	const int dstFieldSize = quadsCount * (quadSize - 1) + 1;//524289;// = 2^19 + 1 > 1201 * 360 - (360 - 1)
	incLat_merc = incLon_merc = 2.0 * POLE / (vec_t)(dstFieldSize - 1);

	int qm_start_in_grid = (POLE - qm_start) / (incLat_merc * (quadSize - 1));
	int qm_end_in_grid = (POLE - qm_end) / (incLat_merc * (quadSize - 1));
	int qn_start_in_grid = (qn_start - POLE) / (incLon_merc * (quadSize - 1));
	int qn_end_in_grid = (qn_end - POLE) / (incLon_merc * (quadSize - 1));

	std::cout << "qm_start_in_grid: " << qm_start_in_grid << "<->" << qm_end_in_grid << "\n";
	std::cout << "qn_start_in_grid: " << qn_start_in_grid << "<->" << qn_end_in_grid << "\n";

	HgtFilesGrid* demGrid = new HgtFilesGrid();
	
	demGrid->Init(4, inputdir.c_str());
	
	HgtFormat srcHgtFormat(1201, 1201, 1.0 / 1200.0);// 3 / 3600 == 1 / ( 1201 - 1 ) deg.
	HgtFormat srcField(srcHgtFormat.nrows * 180 - (180 - 1), srcHgtFormat.ncols * 360 - (360 - 1));
	HgtFormat dstField(dstFieldSize, dstFieldSize);

	int quadSize2 = quadSize * quadSize;
	vec_t* quadHeightData = new vec_t[quadSize2];

	vec3_t tr[3];
	vec3_t line[2];
	vecSet(line[0], 0.0, 1000000.0, 0.0);
	vecSet(line[1], 0.0, -1000000.0, 0.0);
	//LogAll("Adaptation prepared to proceed...\n");

	double lon_d = 0, lat_d = 0;
	double coordi = 0, coordj = 0;

	for (int qm = 0; qm < quadsCount; qm++) {

		if (qm >= qm_start_in_grid && qm <= qm_end_in_grid) {
			std::cout << qm << "/" << quadsCount << "\n";
			for (int qn = 0; qn < quadsCount; qn++)
			{
				bool isZeroHeight = true;
				//std::cout << "    " << quadsCount << "/" << qn << "\n";
				for (int i = 0; i < quadSize; i++) {
					//std::cout << i << "/" << quadSize << "\n";
					for (int j = 0; j < quadSize; j++) {
						coordi = POLE - ((quadSize - 1) * qm + i) * incLat_merc;
						coordj = (-1) * POLE + ((quadSize - 1) * qn + j) * incLon_merc;

						lat_d = Merc2Lat(coordi);
						lon_d = Merc2Lon(coordj);
						//int test = 100000 % (i+1);
						//std::cout << "    " << test << "\n";
						if (qn == 0 && i == 0 && j == 0 ||
							qn == quadsCount - 1 && i == quadSize - 1 && j == quadSize - 1
							) {
							std::cout << "    lon: " << lon_d << " lat: " << lat_d << "\n";
						}

						int demFileIndex_i = (int)ceil(90.0 - lat_d);
						int demFileIndex_j = (int)floor(180.0 + lon_d);

						vec_t onedlat = DegTail(lat_d);
						vec_t onedlon = DegTail(lon_d);

						int indLat = (int)floor(onedlat / srcHgtFormat.cellsize);
						int i00 = 1200 - 1 - indLat;
						int j00 = (int)floor(onedlon / srcHgtFormat.cellsize);

						vec_t h00 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00);
						vec_t h01 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00 + 1);
						vec_t h10 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00);

						vec_t cornerLat = 90 - demFileIndex_i;
						vec_t cornerLon = -180 + demFileIndex_j;

						vecSet(tr[0],
							cornerLon + j00 * srcHgtFormat.cellsize,
							h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[2],
							cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
							j00 < srcHgtFormat.ncols - 1 ? h01 : h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[1],
							cornerLon + j00 * srcHgtFormat.cellsize,
							i00 < srcHgtFormat.nrows - 1 ? h10 : h00,
							cornerLat + indLat * srcHgtFormat.cellsize);

						line[0][X] = line[1][X] = lon_d;
						line[0][Z] = line[1][Z] = lat_d;

						vec_t h11 = 0;

						vec_t edge = ((line[0][X] - tr[2][X]) * (tr[1][Z] - tr[2][Z]) - (line[0][Z] - tr[2][Z]) * (tr[1][X] - tr[2][X]));

						if (edge < 0.0)
						{
							h11 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00 + 1);

							vecSet(tr[0],
								cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
								i00 < srcHgtFormat.nrows - 1 && j00 < srcHgtFormat.ncols - 1 ? h11 :
								i00 < srcHgtFormat.nrows - 1 ? h10 :
								j00 < srcHgtFormat.nrows - 1 ? h01 :
								h00,
								cornerLat + indLat * srcHgtFormat.cellsize);
						}

						quadHeightData[i * quadSize + j] = 0;

						if (h00 != 0 || h01 != 0 || h10 != 0 || h11 != 0) {
							vec_t h = LineIntersectPlane(tr, line);
							quadHeightData[i * quadSize + j] = h;
							if (h > 0)
								isZeroHeight = false;
						}
					}
				}


				if (!isZeroHeight) {
					//std::cout << "    isZeroHeight : " << isZeroHeight << "\n";
					//std::cout << qm << "\n";
					char ccn[10];
					FILE* fp;

					std::string zoomDir(outputdir);
					sprintf(ccn, "%d", zoom);
					zoomDir.append(ccn);

					mkdir(zoomDir.c_str(), S_IRWXU);

					sprintf(ccn, "%d", qm);
					mkdir(zoomDir.append("/").append(ccn).c_str(), S_IRWXU);

					std::string fileName(zoomDir);
					fileName.append("/");
					sprintf(ccn, "%d", qn);
					fileName.append(ccn).append(".ddm");

					std::cout << "droping: " << fileName << "\n";
					fp = fopen(fileName.c_str(), "wb");

					if (fp == NULL) {
						//LogAll(std::string("Error: ").append(fileName).append("\n").c_str());
						return 1;
					}
					else {
						//LogAll(fileName.append("\n").c_str());
					}

					float* quadHeightData_fl = new float[quadSize2];
					for (int i = 0; i < quadSize2; i++) {
						quadHeightData_fl[i] = quadHeightData[i];
					}

					fwrite(quadHeightData_fl, sizeof(float), quadSize2, fp);
					delete[] quadHeightData_fl;
					fclose(fp);
				}

			}
		}
	}

	delete[] quadHeightData;
    return 0;    
}